

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

Gia_Man_t * Gia_ManUpdateExtraAig2(void *pTime,Gia_Man_t *p,Vec_Int_t *vBoxesLeft)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar5;
  int iOutFirst;
  int iBox;
  int k;
  int i;
  Vec_Int_t *vOutsLeft;
  int nRealPis;
  Tim_Man_t *pManTime;
  Gia_Man_t *pNew;
  Vec_Int_t *vBoxesLeft_local;
  Gia_Man_t *p_local;
  void *pTime_local;
  
  iVar1 = Tim_ManPiNum((Tim_Man_t *)pTime);
  p_00 = Vec_IntAlloc(100);
  iVar2 = Vec_IntSize(vBoxesLeft);
  iVar3 = Tim_ManBoxNum((Tim_Man_t *)pTime);
  if (iVar3 < iVar2) {
    __assert_fail("Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(pManTime)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x2d0,"Gia_Man_t *Gia_ManUpdateExtraAig2(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  iVar2 = Gia_ManCoNum(p);
  iVar3 = Tim_ManCiNum((Tim_Man_t *)pTime);
  if (iVar2 != iVar3 - iVar1) {
    __assert_fail("Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - nRealPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                  ,0x2d1,"Gia_Man_t *Gia_ManUpdateExtraAig2(void *, Gia_Man_t *, Vec_Int_t *)");
  }
  for (iBox = 0; iVar2 = Vec_IntSize(vBoxesLeft), iBox < iVar2; iBox = iBox + 1) {
    iVar2 = Vec_IntEntry(vBoxesLeft,iBox);
    iVar3 = Tim_ManBoxOutputFirst((Tim_Man_t *)pTime,iVar2);
    for (iOutFirst = 0; iVar4 = Tim_ManBoxOutputNum((Tim_Man_t *)pTime,iVar2), iOutFirst < iVar4;
        iOutFirst = iOutFirst + 1) {
      Vec_IntPush(p_00,(iVar3 - iVar1) + iOutFirst);
    }
  }
  pGVar5 = Gia_ManDupSelectedOutputs(p,p_00);
  Vec_IntFree(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManUpdateExtraAig2( void * pTime, Gia_Man_t * p, Vec_Int_t * vBoxesLeft )
{
    Gia_Man_t * pNew;
    Tim_Man_t * pManTime = (Tim_Man_t *)pTime;
    int nRealPis = Tim_ManPiNum(pManTime);
    Vec_Int_t * vOutsLeft = Vec_IntAlloc( 100 );
    int i, k, iBox, iOutFirst;
    assert( Vec_IntSize(vBoxesLeft) <= Tim_ManBoxNum(pManTime) );
    assert( Gia_ManCoNum(p) == Tim_ManCiNum(pManTime) - nRealPis );
    Vec_IntForEachEntry( vBoxesLeft, iBox, i )
    {
        iOutFirst = Tim_ManBoxOutputFirst(pManTime, iBox) - nRealPis;
        for ( k = 0; k < Tim_ManBoxOutputNum(pManTime, iBox); k++ )
            Vec_IntPush( vOutsLeft, iOutFirst + k );
    }
    pNew = Gia_ManDupSelectedOutputs( p, vOutsLeft );
    Vec_IntFree( vOutsLeft );
    return pNew;
}